

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_audit.cpp
# Opt level: O3

void compare_single_struct(t_struct *newStruct,t_struct *oldStruct,string *oldStructName)

{
  uint uVar1;
  uint uVar2;
  pointer pcVar3;
  pointer pptVar4;
  pointer pptVar5;
  t_field *newField;
  t_field *oldField;
  int iVar6;
  undefined4 extraout_var;
  size_type sVar7;
  char *fmt;
  pointer pptVar8;
  pointer pptVar9;
  string structName;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  string local_50;
  
  sVar7 = oldStructName->_M_string_length;
  if (sVar7 == 0) {
    iVar6 = (*(oldStruct->super_t_type).super_t_doc._vptr_t_doc[3])(oldStruct);
    oldStructName = (string *)CONCAT44(extraout_var,iVar6);
    sVar7 = oldStructName->_M_string_length;
  }
  local_70 = local_60;
  pcVar3 = (oldStructName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar3,pcVar3 + sVar7);
  pptVar9 = (oldStruct->members_in_id_order_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar8 = (newStruct->members_in_id_order_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
LAB_00137473:
  do {
    pptVar4 = (oldStruct->members_in_id_order_).
              super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pptVar5 = (newStruct->members_in_id_order_).
              super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      if (pptVar9 == pptVar4) {
        if (pptVar8 == pptVar5) {
          if (local_70 != local_60) {
            operator_delete(local_70);
          }
          return;
        }
        if (pptVar9 != pptVar4) goto LAB_001374b1;
        if ((*pptVar8)->req_ == T_REQUIRED) {
          uVar1 = (*pptVar8)->key_;
          fmt = "Required Struct Field Added for Id = %d in %s \n";
          goto LAB_0013758c;
        }
LAB_00137532:
        pptVar8 = pptVar8 + 1;
        goto LAB_00137473;
      }
      if (pptVar8 == pptVar5 && pptVar9 != pptVar4) {
        uVar2 = (*pptVar9)->key_;
        break;
      }
LAB_001374b1:
      newField = *pptVar8;
      uVar1 = newField->key_;
      oldField = *pptVar9;
      uVar2 = oldField->key_;
      if (uVar1 == uVar2) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_70,local_70 + local_68);
        compare_struct_field(newField,oldField,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pptVar9 = pptVar9 + 1;
        goto LAB_00137532;
      }
      if ((int)uVar1 < (int)uVar2) {
        fmt = "Struct field is added in the middle with Id = %d in %s\n";
LAB_0013758c:
        thrift_audit_failure(fmt,(ulong)uVar1,local_70);
        goto LAB_00137532;
      }
    } while ((int)uVar1 <= (int)uVar2);
    thrift_audit_failure("Struct Field removed for Id = %d in %s \n",(ulong)uVar2,local_70);
    pptVar9 = pptVar9 + 1;
  } while( true );
}

Assistant:

void compare_single_struct(t_struct* newStruct, t_struct* oldStruct, const std::string& oldStructName = std::string())
{
   std::string structName = oldStructName.empty() ? oldStruct->get_name() : oldStructName;
   const std::vector<t_field*>& oldStructMembersInIdOrder = oldStruct->get_sorted_members();
   const std::vector<t_field*>& newStructMembersInIdOrder = newStruct->get_sorted_members();
   auto oldStructMemberIt = oldStructMembersInIdOrder.begin();
   auto newStructMemberIt = newStructMembersInIdOrder.begin();

   // Since we have the struct members in their ID order, comparing their IDs can be done by traversing the two member
   // lists together.
   while(!(oldStructMemberIt == oldStructMembersInIdOrder.end() && newStructMemberIt == newStructMembersInIdOrder.end()))
   {
      if(newStructMemberIt == newStructMembersInIdOrder.end() && oldStructMemberIt != oldStructMembersInIdOrder.end())
      {
         // A field ID has been removed from the end.
         thrift_audit_failure("Struct Field removed for Id = %d in %s \n", (*oldStructMemberIt)->get_key(), structName.c_str());
         oldStructMemberIt++;
      }
      else if(newStructMemberIt != newStructMembersInIdOrder.end() && oldStructMemberIt == oldStructMembersInIdOrder.end())
      {
         //New field ID has been added to the end.
         if((*newStructMemberIt)->get_req() == t_field::T_REQUIRED)
         {
            thrift_audit_failure("Required Struct Field Added for Id = %d in %s \n", (*newStructMemberIt)->get_key(), structName.c_str());
         }
         newStructMemberIt++;
      }
      else if((*newStructMemberIt)->get_key() == (*oldStructMemberIt)->get_key())
      {
         //Field ID found in both structs. Compare field types, default values.
         compare_struct_field(*newStructMemberIt, *oldStructMemberIt, structName);

         newStructMemberIt++;
         oldStructMemberIt++;
      }
      else if((*newStructMemberIt)->get_key() < (*oldStructMemberIt)->get_key())
      {
         //New Field Id is inserted in between
         //Adding fields to struct is fine, but adding them in the middle is suspicious. Error!!
         thrift_audit_failure("Struct field is added in the middle with Id = %d in %s\n",  (*newStructMemberIt)->get_key(),  structName.c_str());
         newStructMemberIt++;
      }
      else if((*newStructMemberIt)->get_key() > (*oldStructMemberIt)->get_key())
      {
         //A field is deleted in newStruct.
         thrift_audit_failure("Struct Field removed for Id = %d in %s \n",  (*oldStructMemberIt)->get_key(), structName.c_str());
         oldStructMemberIt++;
      }

   }
}